

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::addClause(SAT *this,Clause *c,bool one_watch)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Lit *pLVar5;
  int *piVar6;
  ostream *poVar7;
  ostream *poVar8;
  size_type sVar9;
  mapped_type *this_00;
  byte in_DL;
  Clause *in_RSI;
  char *pcVar10;
  long in_RDI;
  uint i_2;
  stringstream s;
  uint i_1;
  set<int,_std::less<int>,_std::allocator<int>_> levels;
  uint i;
  int in_stack_fffffffffffffc5c;
  SAT *in_stack_fffffffffffffc60;
  SAT *in_stack_fffffffffffffc68;
  Lit in_stack_fffffffffffffc70;
  Lit in_stack_fffffffffffffc74;
  value_type_conflict *in_stack_fffffffffffffc78;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffc80;
  SAT *in_stack_fffffffffffffc90;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  Lit in_stack_fffffffffffffca4;
  string local_2c0 [36];
  int local_29c;
  string local_298 [36];
  uint local_274;
  stringstream local_270 [16];
  ostream local_260 [252];
  int in_stack_fffffffffffffe9c;
  uint local_c4;
  WatchElem local_88;
  int local_80;
  int local_7c;
  WatchElem local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  int local_50;
  int local_4c;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  Reason local_30;
  int local_28;
  int8_t local_21;
  int local_20;
  lbool local_1a;
  int8_t local_19;
  int local_18;
  lbool local_12;
  byte local_11;
  Clause *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  uVar2 = Clause::size(in_RSI);
  if (uVar2 == 1) {
    pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    local_18 = pLVar5->x;
    local_12 = value(in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
    local_19 = ::l_False.value;
    bVar1 = lbool::operator==(&local_12,::l_False);
    if (bVar1) {
      printf("=====UNSATISFIABLE=====\n");
      printf("%% Top level failure!\n");
      exit(0);
    }
    pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    local_20 = pLVar5->x;
    local_1a = value(in_stack_fffffffffffffc68,in_stack_fffffffffffffc70);
    local_21 = ::l_Undef.value;
    bVar1 = lbool::operator==(&local_1a,::l_Undef);
    if (bVar1) {
      pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      local_28 = pLVar5->x;
      Reason::Reason(&local_30,(Clause *)0x0);
      enqueue(in_stack_fffffffffffffc90,in_stack_fffffffffffffca4,(Reason)in_stack_fffffffffffffc98)
      ;
    }
    free(local_10);
  }
  else {
    if (((ulong)*local_10 & 1) == 0) {
      uVar2 = Clause::size(local_10);
      if (uVar2 == 2) {
        *(int *)(in_RDI + 0x1f0) = *(int *)(in_RDI + 0x1f0) + 1;
      }
      else {
        uVar2 = Clause::size(local_10);
        if (uVar2 == 3) {
          *(int *)(in_RDI + 500) = *(int *)(in_RDI + 500) + 1;
        }
        else {
          *(int *)(in_RDI + 0x1f8) = *(int *)(in_RDI + 0x1f8) + 1;
        }
      }
    }
    if (((ulong)*local_10 & 1) != 0) {
      for (local_34 = 0; uVar2 = local_34, uVar3 = Clause::size(local_10), uVar2 < uVar3;
          local_34 = local_34 + 1) {
        pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
        local_38 = pLVar5->x;
        ::var((Lit)local_38);
        incVarUse(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      }
    }
    uVar2 = Clause::size(local_10);
    if ((uVar2 == 2) && ((((ulong)*local_10 & 1) == 0 || ((so.bin_clause_opt & 1U) != 0)))) {
      if ((local_11 & 1) == 0) {
        pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
        local_40 = pLVar5->x;
        local_3c = (int)operator~((Lit)0x291325);
        uVar2 = toInt((Lit)local_3c);
        vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar2);
        pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
        local_4c = pLVar5->x;
        WatchElem::WatchElem((WatchElem *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc74);
        vec<WatchElem>::push
                  ((vec<WatchElem> *)
                   CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70.x),
                   (WatchElem *)in_stack_fffffffffffffc68);
      }
      pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      local_54 = pLVar5->x;
      local_50 = (int)operator~((Lit)0x2913ce);
      uVar2 = toInt((Lit)local_50);
      vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar2);
      pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      local_64 = pLVar5->x;
      WatchElem::WatchElem((WatchElem *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc74);
      vec<WatchElem>::push
                ((vec<WatchElem> *)CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70.x)
                 ,(WatchElem *)in_stack_fffffffffffffc68);
      if (((ulong)*local_10 & 1) == 0) {
        free(local_10);
      }
    }
    else {
      if ((local_11 & 1) == 0) {
        pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
        local_6c = pLVar5->x;
        local_68 = (int)operator~((Lit)0x2914a3);
        uVar2 = toInt((Lit)local_68);
        vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar2);
        WatchElem::WatchElem(&local_78,local_10);
        vec<WatchElem>::push
                  ((vec<WatchElem> *)
                   CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70.x),
                   (WatchElem *)in_stack_fffffffffffffc68);
      }
      pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
      local_80 = pLVar5->x;
      local_7c = (int)operator~((Lit)0x291532);
      uVar2 = toInt((Lit)local_7c);
      vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar2);
      WatchElem::WatchElem(&local_88,local_10);
      vec<WatchElem>::push
                ((vec<WatchElem> *)CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70.x)
                 ,(WatchElem *)in_stack_fffffffffffffc68);
      if (((ulong)*local_10 & 1) == 0) {
        uVar2 = Clause::size(local_10);
        *(ulong *)(in_RDI + 0x220) = (ulong)uVar2 + *(long *)(in_RDI + 0x220);
      }
      else {
        uVar2 = Clause::size(local_10);
        *(ulong *)(in_RDI + 0x228) = (ulong)uVar2 + *(long *)(in_RDI + 0x228);
      }
      if (((ulong)*local_10 & 1) == 0) {
        vec<Clause_*>::push((vec<Clause_*> *)
                            CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70.x),
                            (Clause **)in_stack_fffffffffffffc68);
      }
      else {
        vec<Clause_*>::push((vec<Clause_*> *)
                            CONCAT44(in_stack_fffffffffffffc74.x,in_stack_fffffffffffffc70.x),
                            (Clause **)in_stack_fffffffffffffc68);
        if ((so.learnt_stats & 1U) != 0) {
          std::set<int,_std::less<int>,_std::allocator<int>_>::set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x291648);
          for (local_c4 = 0; uVar2 = Clause::size(local_10), local_c4 < uVar2;
              local_c4 = local_c4 + 1) {
            vec<int>::operator[]((vec<int> *)(in_RDI + 0x110),local_c4);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          }
          std::__cxx11::stringstream::stringstream(local_270);
          piVar6 = Clause::clauseID(local_10);
          poVar7 = (ostream *)std::ostream::operator<<(local_260,*piVar6);
          poVar7 = std::operator<<(poVar7,",");
          uVar2 = Clause::size(local_10);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar2);
          poVar8 = std::operator<<(poVar7,",");
          sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2917c6);
          std::ostream::operator<<(poVar8,sVar9);
          if ((so.learnt_stats_nogood & 1U) != 0) {
            std::operator<<(local_260,",");
            for (local_274 = 0; uVar3 = local_274, uVar4 = Clause::size(local_10), uVar3 < uVar4;
                local_274 = local_274 + 1) {
              pcVar10 = " ";
              if (local_274 == 0) {
                pcVar10 = "";
              }
              poVar8 = std::operator<<(local_260,pcVar10);
              pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffc60,
                                          in_stack_fffffffffffffc5c);
              local_29c = pLVar5->x;
              toInt((Lit)local_29c);
              getLitString_abi_cxx11_(in_stack_fffffffffffffe9c);
              std::operator<<(poVar8,local_298);
              std::__cxx11::string::~string(local_298);
            }
          }
          std::__cxx11::stringstream::str();
          Clause::clauseID(local_10);
          this_00 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)CONCAT44(uVar2,in_stack_fffffffffffffca0),(key_type *)poVar7);
          std::__cxx11::string::operator=((string *)this_00,local_2c0);
          std::__cxx11::string::~string(local_2c0);
          std::__cxx11::stringstream::~stringstream(local_270);
          std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2919a9);
        }
      }
    }
  }
  return;
}

Assistant:

void SAT::addClause(Clause& c, bool one_watch) {
	assert(c.size() > 0);
	if (c.size() == 1) {
		assert(decisionLevel() == 0);
		if (DEBUG) {
			fprintf(stderr, "warning: adding length 1 clause!\n");
		}
		if (value(c[0]) == l_False) {
			TL_FAIL();
		}
		if (value(c[0]) == l_Undef) {
			enqueue(c[0]);
		}
		free(&c);
		return;
	}
	if (!c.learnt) {
		if (c.size() == 2) {
			bin_clauses++;
		} else if (c.size() == 3) {
			tern_clauses++;
		} else {
			long_clauses++;
		}
	}

	// Mark lazy lits which are used
	if (c.learnt) {
		for (unsigned int i = 0; i < c.size(); i++) {
			incVarUse(var(c[i]));
		}
	}

	if (c.size() == 2 && ((!c.learnt) || (so.bin_clause_opt))) {
		if (!one_watch) {
			watches[toInt(~c[0])].push(c[1]);
		}
		watches[toInt(~c[1])].push(c[0]);
		if (!c.learnt) {
			free(&c);
		}
		return;
	}
	if (!one_watch) {
		watches[toInt(~c[0])].push(&c);
	}
	watches[toInt(~c[1])].push(&c);
	if (c.learnt) {
		learnts_literals += c.size();
	} else {
		clauses_literals += c.size();
	}
	if (c.learnt) {
		learnts.push(&c);
		if (so.learnt_stats) {
			std::set<int> levels;
			for (unsigned int i = 0; i < c.size(); i++) {
				levels.insert(out_learnt_level[i]);
			}
			std::stringstream s;
			//            s << "learntclause,";
			s << c.clauseID() << "," << c.size() << "," << levels.size();
			if (so.learnt_stats_nogood) {
				s << ",";
				for (unsigned int i = 0; i < c.size(); i++) {
					s << (i == 0 ? "" : " ") << getLitString(toInt(c[i]));
					//              s << " (" << out_learnt_level[i] << ")";
				}
			}
			// std::cerr << "\n";
			learntClauseString[c.clauseID()] = s.str();
		}
	} else {
		clauses.push(&c);
	}
}